

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O2

void __thiscall Abstract<4U>::~Abstract(Abstract<4U> *this)

{
  ~Abstract(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

virtual ~Abstract() {}